

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O3

string * __thiscall
flatbuffers::FlatBufFile::additional_headers_abi_cxx11_
          (string *__return_storage_ptr__,FlatBufFile *this)

{
  pointer pbVar1;
  long *plVar2;
  long *plVar3;
  char *pcVar4;
  char *pcVar5;
  pointer pbVar6;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(this->language_) {
  case kLanguageGo:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "import \"github.com/google/flatbuffers/go\"";
    pcVar4 = "";
    break;
  case kLanguageCpp:
    pbVar6 = (this->parser_->opts).grpc_additional_headers.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->parser_->opts).grpc_additional_headers.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (pbVar6 != pbVar1) {
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      pbVar6 = (this->parser_->opts).grpc_additional_headers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (this->parser_->opts).grpc_additional_headers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar6 == pbVar1) {
        return __return_storage_ptr__;
      }
      do {
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::operator+(&local_50,"#include \"",pbVar6);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_60 = *plVar3;
          lStack_58 = plVar2[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar3;
          local_70 = (long *)*plVar2;
        }
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar1);
      return __return_storage_ptr__;
    }
    pcVar5 = "#include \"flatbuffers/grpc.h\"\n";
    pcVar4 = "";
    break;
  case kLanguageJava:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "import com.google.flatbuffers.grpc.FlatbuffersUtils;";
    pcVar4 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "";
    pcVar5 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string additional_headers() const {
    switch (language_) {
      case kLanguageCpp: {
        if (!parser_.opts.grpc_additional_headers.empty()) {
          std::string result = "";
          for (const std::string &header :
               parser_.opts.grpc_additional_headers) {
            if (!result.empty()) result += "\n";
            result += "#include \"" + header + "\"";
          }
          return result;
        }
        return "#include \"flatbuffers/grpc.h\"\n";
      }
      case kLanguageGo: {
        return "import \"github.com/google/flatbuffers/go\"";
      }
      case kLanguageJava: {
        return "import com.google.flatbuffers.grpc.FlatbuffersUtils;";
      }
      case kLanguagePython: {
        return "";
      }
      case kLanguageSwift: {
        return "";
      }
      case kLanguageTS: {
        return "";
      }
    }
    return "";
  }